

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_GiveSecret(AActor *actor,bool printmessage,bool playsound,int sectornum)

{
  FFont *pFVar1;
  bool bVar2;
  char *pcVar3;
  FSoundID local_30 [4];
  FString local_20;
  FString s;
  int sectornum_local;
  bool playsound_local;
  bool printmessage_local;
  AActor *actor_local;
  
  if (actor != (AActor *)0x0) {
    if (actor->player != (player_t *)0x0) {
      actor->player->secretcount = actor->player->secretcount + 1;
    }
    s.Chars._0_4_ = sectornum;
    s.Chars._6_1_ = playsound;
    s.Chars._7_1_ = printmessage;
    bVar2 = FBoolCVar::operator_cast_to_bool(&cl_showsecretmessage);
    if ((bVar2) && (bVar2 = AActor::CheckLocalView(actor,consoleplayer), bVar2)) {
      if ((s.Chars._7_1_ & 1) != 0) {
        bVar2 = FBoolCVar::operator_cast_to_bool(&showsecretsector);
        pFVar1 = SmallFont;
        if ((bVar2) && (-1 < (int)(uint)s.Chars)) {
          pcVar3 = FStringTable::operator[](&GStrings,"SECRETMESSAGE");
          FString::FString(&local_20,pcVar3);
          FString::AppendFormat(&local_20," (Sector %d)",(ulong)(uint)s.Chars);
          pFVar1 = SmallFont;
          pcVar3 = FString::operator_cast_to_char_(&local_20);
          C_MidPrint(pFVar1,pcVar3);
          FString::~FString(&local_20);
        }
        else {
          pcVar3 = FStringTable::operator[](&GStrings,"SECRETMESSAGE");
          C_MidPrint(pFVar1,pcVar3);
        }
      }
      if ((s.Chars._6_1_ & 1) != 0) {
        FSoundID::FSoundID(local_30,"misc/secret");
        S_Sound(0x20,local_30,1.0,1.0);
      }
    }
  }
  level.found_secrets = level.found_secrets + 1;
  return;
}

Assistant:

void P_GiveSecret(AActor *actor, bool printmessage, bool playsound, int sectornum)
{
	if (actor != NULL)
	{
		if (actor->player != NULL)
		{
			actor->player->secretcount++;
		}
		if (cl_showsecretmessage && actor->CheckLocalView(consoleplayer))
		{
			if (printmessage)
			{
				if (!showsecretsector || sectornum < 0) C_MidPrint(SmallFont, GStrings["SECRETMESSAGE"]);
				else
				{
					FString s = GStrings["SECRETMESSAGE"];
					s.AppendFormat(" (Sector %d)", sectornum);
					C_MidPrint(SmallFont, s);
				}
			}
			if (playsound) S_Sound (CHAN_AUTO | CHAN_UI, "misc/secret", 1, ATTN_NORM);
		}
	}
	level.found_secrets++;
}